

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::VaryingBlockAutomaticMemberLocationsTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingBlockAutomaticMemberLocationsTest *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *__s;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  stringstream stream;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingBlockAutomaticMemberLocationsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingBlockAutomaticMemberLocationsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Stage: ",7);
  __s = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", direction: ",0xd);
  uVar3 = (ulong)ptVar1[test_case_index].m_is_input;
  pcVar4 = "output";
  if (uVar3 != 0) {
    pcVar4 = "input";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,6 - uVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingBlockAutomaticMemberLocationsTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}